

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split_uri.c
# Opt level: O0

int parse_args(int argc,char **argv,int *decode,int *flag)

{
  int iVar1;
  char *pcVar2;
  int c;
  char *progname;
  int *flag_local;
  int *decode_local;
  char **argv_local;
  int argc_local;
  
  *decode = 0;
  *flag = 0;
  pcVar2 = get_progname(*argv);
  if ((argc < 2) || (4 < argc)) {
    fprintf(_stderr,"wrong # args: must be \"%s [-dhpq] uri\"\n",pcVar2);
    argv_local._4_4_ = -2;
  }
  else if ((argc == 2) && (*argv[1] != '-')) {
    argv_local._4_4_ = 0;
  }
  else {
    while (iVar1 = getopt(argc,argv,"dhpq"), iVar1 != -1) {
      switch(iVar1) {
      case 100:
        *decode = 1;
        break;
      default:
        return -2;
      case 0x68:
        fprintf(_stdout,"usage: %s [-dhpq] uri\n",pcVar2);
        return -1;
      case 0x70:
        *flag = 1;
        break;
      case 0x71:
        *flag = 2;
      }
    }
    if (_optind < argc) {
      argv_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"missing a uri\n");
      argv_local._4_4_ = -2;
    }
  }
  return argv_local._4_4_;
}

Assistant:

static int parse_args(int argc, char** argv, int* decode, int* flag)
{
    const char* progname;
    int         c;

    *decode  = 0;
    *flag    = FULLURI;
    progname = get_progname(*argv);

    if (argc < 2 || argc > 4)
        goto wrongArgs;

    if (argc == 2 && argv[1][0] != '-')
        return 0;

    while ((c = getopt(argc, argv, "dhpq")) != -1)
    {
        switch (c)
        {
            case 'd':
                *decode = 1;
                break;
            case 'h':
                fprintf(stdout, "usage: %s [-dhpq] uri\n", progname);
                return EXIT_OK;
            case 'p':
                *flag = PATH;
                break;
            case 'q':
                *flag = QUERY;
                break;
            default:
                return EXIT_ERR;
        }
    }

    if (optind >= argc)
    {
        fprintf(stderr, "missing a uri\n");
        return EXIT_ERR;
    }

    return 0;

wrongArgs:
    fprintf(stderr, "wrong # args: must be \"%s [-dhpq] uri\"\n", progname);
    return EXIT_ERR;
}